

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.h
# Opt level: O2

void __thiscall GameLogic::GameLogic(GameLogic *this)

{
  _Rb_tree_header *p_Var1;
  
  IDManager::IDManager(&this->idManager);
  MapInfo::MapInfo(&this->mapInfo);
  (this->playerID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->playerID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->playerID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->unitInfo)._M_t._M_impl.super__Rb_tree_header;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->actions).
  super__Vector_base<std::pair<int,_Action>,_std::allocator<std::pair<int,_Action>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actions).
  super__Vector_base<std::pair<int,_Action>,_std::allocator<std::pair<int,_Action>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actions).
  super__Vector_base<std::pair<int,_Action>,_std::allocator<std::pair<int,_Action>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->commands).super__Vector_base<Command,_std::allocator<Command>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commands).super__Vector_base<Command,_std::allocator<Command>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commands).super__Vector_base<Command,_std::allocator<Command>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->jsoncmd)._M_dataplus._M_p = (pointer)&(this->jsoncmd).field_2;
  (this->jsoncmd)._M_string_length = 0;
  (this->jsoncmd).field_2._M_local_buf[0] = '\0';
  this->logicStat = NotInitialized;
  return;
}

Assistant:

GameLogic() { logicStat = NotInitialized; }